

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O1

t_pvalue __thiscall
xemmai::t_derived_primitive<double>::f_do_construct
          (t_derived_primitive<double> *this,t_pvalue *a_stack,size_t a_n)

{
  t_heap<xemmai::t_object> *this_00;
  ulong uVar1;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  t_object *p;
  t_object *ptVar2;
  long lVar3;
  t_object *ptVar4;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar5;
  char *pcVar6;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_01;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_02;
  size_t a_size;
  long in_FS_OFFSET;
  double dVar7;
  t_pvalue tVar8;
  
  uVar1 = *(ulong *)(a_n + 0x20);
  if (uVar1 == 3) {
LAB_0015cc81:
    a_n = a_n + 0x28;
    aVar5.v_integer = uVar1 + 0x48;
    if (uVar1 < 5) {
      aVar5.v_integer = a_n;
    }
    dVar7 = (double)(long)*aVar5.v_float;
  }
  else {
    if (uVar1 != 4) {
      if (((uVar1 < 3) || (*(long *)(*(long *)(uVar1 + 0x40) + 8) == 0)) ||
         (*(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) != &v__type_id<double>)) {
        f_do_construct();
      }
      if (uVar1 != 4) {
        if (uVar1 != 3) {
          dVar7 = *(double *)(uVar1 + 0x48);
          goto LAB_0015ccac;
        }
        goto LAB_0015cc81;
      }
    }
    a_n = a_n + 0x28;
    aVar5.v_integer = uVar1 + 0x48;
    if (uVar1 < 5) {
      aVar5.v_integer = a_n;
    }
    dVar7 = *aVar5.v_float;
  }
LAB_0015ccac:
  this_00 = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  a_size = a_stack[3].field_0.v_integer * 0x10 + 0x50;
  if (a_size < 0x81) {
    ptVar4 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar4 == (t_object *)0x0) {
      ptVar4 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this_00);
      ptVar2 = ptVar4->v_next;
      a_n = (size_t)extraout_RDX_02;
    }
    else {
      ptVar2 = ptVar4->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar2;
  }
  else {
    ptVar4 = t_heap<xemmai::t_object>::f_allocate_medium(this_00,a_size);
    a_n = (size_t)extraout_RDX;
  }
  ptVar4->v_next = (t_object *)0x0;
  lVar3 = a_stack[3].field_0.v_integer;
  if (lVar3 != 0) {
    pcVar6 = ptVar4->v_data + 8;
    do {
      pcVar6[0] = '\0';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      pcVar6 = pcVar6 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  *(double *)ptVar4->v_data = dVar7;
  this_01 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_01->v_head = (t_object *)&a_stack[-5].field_0;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<128UL>::f_next(this_01);
    a_n = (size_t)extraout_RDX_00;
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar4->v_type = (t_type *)a_stack;
  this_02 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_02->v_head = ptVar4;
  if (this_02->v_head == this_02->v_next) {
    t_slot::t_queue<256UL>::f_next(this_02);
    a_n = (size_t)extraout_RDX_01;
  }
  else {
    this_02->v_head = this_02->v_head + 1;
  }
  (this->super_t_derived<xemmai::t_type_of<double>_>).super_t_type_of<double>.
  super_t_derivable<xemmai::t_bears<double,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<double>_>
  .super_t_bears<double,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<double,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
  v_this = (t_slot)ptVar4;
  tVar8.field_0 =
       (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)
       (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)a_n;
  tVar8.super_t_pointer.v_p = (t_object *)this;
  return tVar8;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}